

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  bool bVar1;
  ImGuiStyle *pIVar2;
  bool bVar3;
  ImGuiWindow *potential_parent;
  bool bVar4;
  bool local_56;
  bool local_55;
  bool local_54;
  byte local_52;
  bool local_51;
  int local_3c;
  bool mouse_dragging_extern_payload;
  bool mouse_avail_to_imgui;
  int i;
  bool mouse_any_down;
  int mouse_earliest_button_down;
  ImGuiWindow *modal_window;
  bool clear_hovered_windows;
  ImVec2 local_18;
  ImGuiContext *local_10;
  ImGuiContext *g;
  
  local_10 = GImGui;
  pIVar2 = &GImGui->Style;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0,4.0,4.0);
  local_18 = ImMax(&pIVar2->TouchExtraPadding,(ImVec2 *)&stack0xffffffffffffffe0);
  local_10->WindowsHoverPadding = local_18;
  bVar1 = false;
  FindHoveredWindow();
  potential_parent = GetTopMostPopupModal();
  if (((potential_parent != (ImGuiWindow *)0x0) && (local_10->HoveredWindow != (ImGuiWindow *)0x0))
     && (bVar3 = IsWindowChildOf(local_10->HoveredWindow->RootWindow,potential_parent), !bVar3)) {
    bVar1 = true;
  }
  if (((local_10->IO).ConfigFlags & 0x10U) != 0) {
    bVar1 = true;
  }
  i = -1;
  bVar3 = false;
  for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
    if (((local_10->IO).MouseClicked[local_3c] & 1U) != 0) {
      local_51 = true;
      if (local_10->HoveredWindow == (ImGuiWindow *)0x0) {
        local_51 = 0 < (local_10->OpenPopupStack).Size;
      }
      (local_10->IO).MouseDownOwned[local_3c] = local_51;
    }
    bVar3 = bVar3 || ((local_10->IO).MouseDown[local_3c] & 1U) != 0;
    if ((((local_10->IO).MouseDown[local_3c] & 1U) != 0) &&
       ((i == -1 || ((local_10->IO).MouseClickedTime[local_3c] < (local_10->IO).MouseClickedTime[i])
        ))) {
      i = local_3c;
    }
  }
  local_52 = 1;
  if (i != -1) {
    local_52 = (local_10->IO).MouseDownOwned[i];
  }
  bVar4 = false;
  if ((local_10->DragDropActive & 1U) != 0) {
    bVar4 = (local_10->DragDropSourceFlags & 0x10U) != 0;
  }
  if (((local_52 & 1) == 0) && (!bVar4)) {
    bVar1 = true;
  }
  if (bVar1) {
    local_10->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    local_10->HoveredWindow = (ImGuiWindow *)0x0;
  }
  if (local_10->WantCaptureMouseNextFrame == -1) {
    if (((local_52 & 1) == 0) ||
       ((local_54 = true, local_10->HoveredWindow == (ImGuiWindow *)0x0 && (local_54 = true, !bVar3)
        ))) {
      local_54 = 0 < (local_10->OpenPopupStack).Size;
    }
    (local_10->IO).WantCaptureMouse = local_54;
  }
  else {
    (local_10->IO).WantCaptureMouse = local_10->WantCaptureMouseNextFrame != 0;
  }
  if (local_10->WantCaptureKeyboardNextFrame == -1) {
    local_55 = local_10->ActiveId != 0 || potential_parent != (ImGuiWindow *)0x0;
    (local_10->IO).WantCaptureKeyboard = local_55;
  }
  else {
    (local_10->IO).WantCaptureKeyboard = local_10->WantCaptureKeyboardNextFrame != 0;
  }
  if (((((local_10->IO).NavActive & 1U) != 0) && (((local_10->IO).ConfigFlags & 1U) != 0)) &&
     (((local_10->IO).ConfigFlags & 8U) == 0)) {
    (local_10->IO).WantCaptureKeyboard = true;
  }
  if (local_10->WantTextInputNextFrame == -1) {
    local_56 = false;
  }
  else {
    local_56 = local_10->WantTextInputNextFrame != 0;
  }
  (local_10->IO).WantTextInput = local_56;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowChildOf(g.HoveredWindow->RootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}